

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

bool google::protobuf::safe_strtod(char *str,double *value)

{
  bool bVar1;
  double dVar2;
  bool local_21;
  double *local_20;
  char *endptr;
  double *value_local;
  char *str_local;
  
  endptr = (char *)value;
  value_local = (double *)str;
  dVar2 = internal::NoLocaleStrtod(str,(char **)&local_20);
  *(double *)endptr = dVar2;
  if (local_20 != value_local) {
    while (bVar1 = ascii_isspace(*(char *)local_20), bVar1) {
      local_20 = (double *)((long)local_20 + 1);
    }
  }
  local_21 = false;
  if (*(char *)value_local != '\0') {
    local_21 = *(char *)local_20 == '\0';
  }
  return local_21;
}

Assistant:

bool safe_strtod(const char* str, double* value) {
  char* endptr;
  *value = internal::NoLocaleStrtod(str, &endptr);
  if (endptr != str) {
    while (ascii_isspace(*endptr)) ++endptr;
  }
  // Ignore range errors from strtod.  The values it
  // returns on underflow and overflow are the right
  // fallback in a robust setting.
  return *str != '\0' && *endptr == '\0';
}